

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInputSource.cc
# Opt level: O1

void __thiscall
FileInputSource::setFile(FileInputSource *this,char *description,FILE *filep,bool close_file)

{
  char *pcVar1;
  
  pcVar1 = (char *)(this->filename)._M_string_length;
  strlen(description);
  std::__cxx11::string::_M_replace((ulong)&this->filename,0,pcVar1,(ulong)description);
  this->file = filep;
  (*(this->super_InputSource)._vptr_InputSource[5])(this,0,0);
  return;
}

Assistant:

void
FileInputSource::setFile(char const* description, FILE* filep, bool close_file)
{
    this->filename = description;
    this->file = filep;
    this->seek(0, SEEK_SET);
}